

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  Extension *pEVar1;
  MessageLite *in_RDX;
  Extension *extension;
  int in_stack_ffffffffffffff44;
  ExtensionSet *in_stack_ffffffffffffff48;
  MessageLite *local_8;
  
  pEVar1 = FindOrNull(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  local_8 = in_RDX;
  if (pEVar1 != (Extension *)0x0) {
    if (((byte)pEVar1->field_0xa >> 4 & 1) == 0) {
      local_8 = (MessageLite *)(pEVar1->field_0).int64_value;
    }
    else {
      local_8 = (MessageLite *)
                (*(code *)(((((pEVar1->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                           arena_)->impl_).initial_block_)
                          ((pEVar1->field_0).repeated_string_value,in_RDX);
    }
  }
  return local_8;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == NULL) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      return extension->lazymessage_value->GetMessage(default_value);
    } else {
      return *extension->message_value;
    }
  }
}